

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O3

void __thiscall QLabel::setPixmap(QLabel *this,QPixmap *pixmap)

{
  optional<QIcon> *poVar1;
  bool bVar2;
  QLabelPrivate *this_00;
  _Storage<QIcon,_false> _Var3;
  undefined8 uVar4;
  long lVar5;
  QSize QVar6;
  long lVar7;
  long in_FS_OFFSET;
  bool bVar8;
  double dVar9;
  undefined1 auVar10 [16];
  _Storage<QIcon,_false> local_70;
  _Storage<QIcon,_false> local_68 [3];
  QArrayData *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLabelPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  poVar1 = &this_00->icon;
  bVar2 = (this_00->icon).super__Optional_base<QIcon,_false,_false>._M_payload.
          super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>.
          _M_engaged;
  if (bVar2 == true) {
    QIcon::availableSizes((Mode)&local_50,(State)poVar1);
    uVar4 = QPixmap::size();
    if (local_40 == 0) goto LAB_0040f387;
    lVar7 = 0;
    do {
      lVar5 = lVar7;
      if (local_40 << 3 == lVar5) goto LAB_0040f387;
      lVar7 = lVar5 + 8;
    } while ((*(int *)(local_48 + lVar5) != (int)uVar4) ||
            (*(int *)(local_48 + 4 + lVar5) != (int)((ulong)uVar4 >> 0x20)));
    if (lVar7 == 0) goto LAB_0040f387;
    if ((this_00->icon).super__Optional_base<QIcon,_false,_false>._M_payload.
        super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>.
        _M_engaged == false) {
      setPixmap();
      goto LAB_0040f4e2;
    }
    local_70 = (_Storage<QIcon,_false>)QPixmap::size();
    QIcon::pixmap((QSize *)local_68,(State)poVar1,(State)(QSize *)&local_70);
    lVar7 = QPixmap::cacheKey();
    lVar5 = QPixmap::cacheKey();
    bVar8 = lVar7 == lVar5;
    QPixmap::~QPixmap((QPixmap *)local_68);
  }
  else {
LAB_0040f387:
    bVar8 = false;
  }
  if ((bVar2 != false) && (local_50 != (QArrayData *)0x0)) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,8,0x10);
    }
  }
  if (!bVar8) {
    QLabelPrivate::clearContents(this_00);
    QIcon::QIcon((QIcon *)&local_70,pixmap);
    _Var3 = local_70;
    if ((this_00->icon).super__Optional_base<QIcon,_false,_false>._M_payload.
        super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>.
        _M_engaged == true) {
      local_70 = (_Storage<QIcon,_false>)0x0;
      local_68[0] = (poVar1->super__Optional_base<QIcon,_false,_false>)._M_payload.
                    super__Optional_payload<QIcon,_true,_false,_false>.
                    super__Optional_payload_base<QIcon>._M_payload;
      (poVar1->super__Optional_base<QIcon,_false,_false>)._M_payload.
      super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>.
      _M_payload = _Var3;
      QIcon::~QIcon((QIcon *)local_68);
    }
    else {
      local_70 = (_Storage<QIcon,_false>)0x0;
      (this_00->icon).super__Optional_base<QIcon,_false,_false>._M_payload.
      super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>.
      _M_payload = _Var3;
      (this_00->icon).super__Optional_base<QIcon,_false,_false>._M_payload.
      super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>.
      _M_engaged = true;
    }
    QIcon::~QIcon((QIcon *)&local_70);
    auVar10 = QPixmap::deviceIndependentSize();
    dVar9 = (double)((ulong)auVar10._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar10._0_8_
    ;
    bVar2 = 2147483647.0 < dVar9;
    if (dVar9 <= -2147483648.0) {
      dVar9 = -2147483648.0;
    }
    QVar6.wd.m_i = (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar9)
    ;
    dVar9 = (double)((ulong)auVar10._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar10._8_8_
    ;
    bVar2 = 2147483647.0 < dVar9;
    if (dVar9 <= -2147483648.0) {
      dVar9 = -2147483648.0;
    }
    QVar6.ht.m_i = (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar9)
    ;
    this_00->pixmapSize = QVar6;
    QLabelPrivate::updateLabel(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0040f4e2:
  __stack_chk_fail();
}

Assistant:

void QLabel::setPixmap(const QPixmap &pixmap)
{
    Q_D(QLabel);
    if (d->icon && d->icon->availableSizes().contains(pixmap.size()) &&
        d->icon->pixmap(pixmap.size()).cacheKey() == pixmap.cacheKey())
        return;
    d->clearContents();
    d->icon = QIcon(pixmap);
    d->pixmapSize = pixmap.deviceIndependentSize().toSize();
    d->updateLabel();
}